

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

DebugAnnotation * __thiscall
perfetto::protos::gen::DebugAnnotation::operator=(DebugAnnotation *this,DebugAnnotation *param_1)

{
  uint64_t uVar1;
  double dVar2;
  bool bVar3;
  undefined7 uVar4;
  
  this->name_iid_ = param_1->name_iid_;
  ::std::__cxx11::string::_M_assign((string *)&this->name_);
  bVar3 = param_1->bool_value_;
  uVar4 = *(undefined7 *)&param_1->field_0x31;
  uVar1 = param_1->uint_value_;
  dVar2 = param_1->double_value_;
  this->int_value_ = param_1->int_value_;
  this->double_value_ = dVar2;
  this->bool_value_ = bVar3;
  *(undefined7 *)&this->field_0x31 = uVar4;
  this->uint_value_ = uVar1;
  ::std::__cxx11::string::_M_assign((string *)&this->string_value_);
  this->pointer_value_ = param_1->pointer_value_;
  DebugAnnotation_NestedValue::operator=
            ((this->nested_value_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::default_delete<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::DebugAnnotation_NestedValue_*,_std::default_delete<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
             .super__Head_base<0UL,_perfetto::protos::gen::DebugAnnotation_NestedValue_*,_false>.
             _M_head_impl,
             (param_1->nested_value_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::default_delete<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::DebugAnnotation_NestedValue_*,_std::default_delete<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
             .super__Head_base<0UL,_perfetto::protos::gen::DebugAnnotation_NestedValue_*,_false>.
             _M_head_impl);
  ::std::__cxx11::string::_M_assign((string *)&this->legacy_json_value_);
  ::std::__cxx11::string::_M_assign((string *)&this->proto_type_name_);
  this->proto_type_name_iid_ = param_1->proto_type_name_iid_;
  ::std::__cxx11::string::_M_assign((string *)&this->proto_value_);
  std::
  vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ::operator=(&this->dict_entries_,&param_1->dict_entries_);
  std::
  vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ::operator=(&this->array_values_,&param_1->array_values_);
  ::std::__cxx11::string::_M_assign((string *)&this->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

DebugAnnotation::DebugAnnotation(const DebugAnnotation&) = default;